

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwizard.cpp
# Opt level: O3

QWizard * __thiscall QWizard::pixmap(QWizard *this,WizardPixmap which)

{
  uint in_EDX;
  undefined4 in_register_00000034;
  
  QPixmap::QPixmap((QPixmap *)this,
                   (QPixmap *)
                   (*(long *)(CONCAT44(in_register_00000034,which) + 8) + (ulong)in_EDX * 0x18 +
                   0x3c0));
  return this;
}

Assistant:

QPixmap QWizard::pixmap(WizardPixmap which) const
{
    Q_D(const QWizard);
    Q_ASSERT(uint(which) < NPixmaps);
#ifdef Q_OS_MACOS
    if (which == BackgroundPixmap && d->defaultPixmaps[BackgroundPixmap].isNull())
        d->defaultPixmaps[BackgroundPixmap] = d->findDefaultBackgroundPixmap();
#endif
    return d->defaultPixmaps[which];
}